

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nn.cc
# Opt level: O0

void finish_setup(nn *n,vw *all)

{
  uint32_t uVar1;
  ostream *this;
  float *pfVar2;
  long in_RSI;
  uint *in_RDI;
  features *outfs;
  stringstream ss;
  uint i;
  features *fs;
  uint64_t nn_index;
  parameters *in_stack_fffffffffffffd58;
  v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffd60;
  v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  undefined8 in_stack_fffffffffffffd68;
  feature_value v;
  features *in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd84;
  char (*in_stack_fffffffffffffd88) [1];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffd90;
  char (*in_stack_fffffffffffffda0) [17];
  char (*in_stack_fffffffffffffda8) [1];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffdb0;
  v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_230;
  char local_208 [23];
  undefined1 local_1f1;
  string local_1f0 [64];
  stringstream local_1b0 [16];
  ostream local_1a0;
  uint local_24;
  uint *local_20;
  long local_18;
  long local_10;
  uint *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  memset(in_RDI + 4,0,0x68d0);
  v_array<unsigned_char>::push_back
            ((v_array<unsigned_char> *)in_stack_fffffffffffffd60,&in_stack_fffffffffffffd58->sparse)
  ;
  uVar1 = parameters::stride_shift(in_stack_fffffffffffffd58);
  local_18 = 0x1fca64ebL << ((byte)uVar1 & 0x3f);
  local_20 = local_8 + 0xd26;
  for (local_24 = 0; v = (feature_value)((ulong)in_stack_fffffffffffffd68 >> 0x20),
      local_24 < *local_8; local_24 = local_24 + 1) {
    features::push_back(in_stack_fffffffffffffd70,v,(feature_index)in_stack_fffffffffffffd60);
    if (((*(byte *)(local_10 + 0x3438) & 1) != 0) || ((*(byte *)(local_10 + 0x3618) & 1) != 0)) {
      std::__cxx11::stringstream::stringstream(local_1b0);
      this = std::operator<<(&local_1a0,"OutputLayer");
      std::ostream::operator<<(this,local_24);
      operator_new(0x40);
      local_1f1 = 1;
      std::__cxx11::stringstream::str();
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<const_char_(&)[1],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
      local_1f1 = 0;
      std::shared_ptr<std::pair<std::__cxx11::string,std::__cxx11::string>>::
      shared_ptr<std::pair<std::__cxx11::string,std::__cxx11::string>,void>
                ((shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffffd60,
                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffffd58);
      v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::push_back(in_stack_fffffffffffffd60,
                  (shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffd58);
      std::
      shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~shared_ptr((shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)0x2e50a6);
      std::__cxx11::string::~string(local_1f0);
      std::__cxx11::stringstream::~stringstream(local_1b0);
    }
    local_18 = *(long *)(local_8 + 0x4ea2) + local_18;
  }
  *(ulong *)(local_8 + 0x1a2c) = (ulong)*local_8 + *(long *)(local_8 + 0x1a2c);
  if ((local_8[0x4eaa] & 1) == 0) {
    features::push_back(in_stack_fffffffffffffd70,v,(feature_index)in_stack_fffffffffffffd60);
    if (((*(byte *)(local_10 + 0x3438) & 1) != 0) || ((*(byte *)(local_10 + 0x3618) & 1) != 0)) {
      in_stack_fffffffffffffda8 = (char (*) [1])(local_20 + 0x10);
      in_stack_fffffffffffffdb0 =
           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)operator_new(0x40);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[1],_const_char_(&)[17],_true>
                (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
      in_stack_fffffffffffffda0 = (char (*) [17])local_208;
      std::shared_ptr<std::pair<std::__cxx11::string,std::__cxx11::string>>::
      shared_ptr<std::pair<std::__cxx11::string,std::__cxx11::string>,void>
                ((shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffffd60,
                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffffd58);
      v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::push_back(in_stack_fffffffffffffd60,
                  (shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffd58);
      std::
      shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~shared_ptr((shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)0x2e527e);
    }
    *(long *)(local_8 + 0x1a2c) = *(long *)(local_8 + 0x1a2c) + 1;
  }
  *(undefined1 *)((long)local_8 + 0x68db) = 1;
  memset(local_8 + 0x1a38,0,0x68d0);
  v_array<unsigned_char>::push_back
            ((v_array<unsigned_char> *)in_stack_fffffffffffffd60,&in_stack_fffffffffffffd58->sparse)
  ;
  features::push_back(in_stack_fffffffffffffd70,v,(feature_index)in_stack_fffffffffffffd60);
  if (((*(byte *)(local_10 + 0x3438) & 1) != 0) || ((*(byte *)(local_10 + 0x3618) & 1) != 0)) {
    operator_new(0x40);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[1],_const_char_(&)[11],_true>
              (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
               (char (*) [11])in_stack_fffffffffffffda0);
    std::shared_ptr<std::pair<std::__cxx11::string,std::__cxx11::string>>::
    shared_ptr<std::pair<std::__cxx11::string,std::__cxx11::string>,void>
              ((shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffd60,
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_fffffffffffffd58);
    v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::push_back(in_stack_fffffffffffffd60,
                (shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffd58);
    std::
    shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~shared_ptr((shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)0x2e53ec);
  }
  local_8[0x3465] = (uint)((float)local_8[0x3465] + 1.0);
  local_8[0x3442] = 0x7f7fffff;
  local_8[0x3454] = 0x3f800000;
  *(undefined1 *)((long)local_8 + 0xd1ab) = 1;
  memset(local_8 + 0x346c,0,0x68d0);
  v_array<unsigned_char>::push_back
            ((v_array<unsigned_char> *)in_stack_fffffffffffffd60,&in_stack_fffffffffffffd58->sparse)
  ;
  local_230.end_array =
       (shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)(local_8 + 0xd26);
  v_array<float>::operator[]((v_array<float> *)local_230.end_array,0);
  v_array<unsigned_long>::operator[]((v_array<unsigned_long> *)((long)local_230.end_array + 0x20),0)
  ;
  features::push_back(in_stack_fffffffffffffd70,v,(feature_index)in_stack_fffffffffffffd60);
  if (((*(byte *)(local_10 + 0x3438) & 1) != 0) || ((*(byte *)(local_10 + 0x3618) & 1) != 0)) {
    operator_new(0x40);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[1],_const_char_(&)[13],_true>
              (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
               (char (*) [13])in_stack_fffffffffffffda0);
    this_00 = &local_230;
    std::shared_ptr<std::pair<std::__cxx11::string,std::__cxx11::string>>::
    shared_ptr<std::pair<std::__cxx11::string,std::__cxx11::string>,void>
              ((shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this_00,
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_fffffffffffffd58);
    v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::push_back(this_00,(shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffffd58);
    std::
    shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~shared_ptr((shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)0x2e55dc);
  }
  pfVar2 = v_array<float>::operator[]((v_array<float> *)(local_8 + 0x418e),0);
  *pfVar2 = 1.0;
  local_8[0x4e99] = (uint)((float)local_8[0x4e99] + 1.0);
  local_8[0x4e76] = 0x7f7fffff;
  local_8[0x4e88] = 0x3f800000;
  *(undefined1 *)((long)local_8 + 0x13a7b) = 1;
  *(undefined1 *)((long)local_8 + 0x13aa9) = 1;
  return;
}

Assistant:

void finish_setup(nn& n, vw& all)
{
  // TODO: output_layer audit

  memset(&n.output_layer, 0, sizeof(n.output_layer));
  n.output_layer.indices.push_back(nn_output_namespace);
  uint64_t nn_index = nn_constant << all.weights.stride_shift();

  features& fs = n.output_layer.feature_space[nn_output_namespace];
  for (unsigned int i = 0; i < n.k; ++i)
  {
    fs.push_back(1., nn_index);
    if (all.audit || all.hash_inv)
    {
      std::stringstream ss;
      ss << "OutputLayer" << i;
      fs.space_names.push_back(audit_strings_ptr(new audit_strings("", ss.str())));
    }
    nn_index += (uint64_t)n.increment;
  }
  n.output_layer.num_features += n.k;

  if (!n.inpass)
  {
    fs.push_back(1., nn_index);
    if (all.audit || all.hash_inv)
      fs.space_names.push_back(audit_strings_ptr(new audit_strings("", "OutputLayerConst")));
    ++n.output_layer.num_features;
  }

  n.output_layer.in_use = true;

  // TODO: not correct if --noconstant
  memset(&n.hiddenbias, 0, sizeof(n.hiddenbias));
  n.hiddenbias.indices.push_back(constant_namespace);
  n.hiddenbias.feature_space[constant_namespace].push_back(1, (uint64_t)constant);
  if (all.audit || all.hash_inv)
    n.hiddenbias.feature_space[constant_namespace].space_names.push_back(
        audit_strings_ptr(new audit_strings("", "HiddenBias")));
  n.hiddenbias.total_sum_feat_sq++;
  n.hiddenbias.l.simple.label = FLT_MAX;
  n.hiddenbias.weight = 1;
  n.hiddenbias.in_use = true;

  memset(&n.outputweight, 0, sizeof(n.outputweight));
  n.outputweight.indices.push_back(nn_output_namespace);
  features& outfs = n.output_layer.feature_space[nn_output_namespace];
  n.outputweight.feature_space[nn_output_namespace].push_back(outfs.values[0], outfs.indicies[0]);
  if (all.audit || all.hash_inv)
    n.outputweight.feature_space[nn_output_namespace].space_names.push_back(
        audit_strings_ptr(new audit_strings("", "OutputWeight")));
  n.outputweight.feature_space[nn_output_namespace].values[0] = 1;
  n.outputweight.total_sum_feat_sq++;
  n.outputweight.l.simple.label = FLT_MAX;
  n.outputweight.weight = 1;
  n.outputweight.in_use = true;

  n.finished_setup = true;
}